

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateCopyConstructorCode
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>((Formatter *)local_50,"$name$_.CopyFrom(from.$name$_);");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateCopyConstructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("$name$_.CopyFrom(from.$name$_);");
}